

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Builder * __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::imbue
          (Builder *__return_storage_ptr__,MembraneCapTableBuilder *this,Builder builder)

{
  CapTableBuilder *pCVar1;
  DebugComparison<capnp::_::CapTableBuilder_*&,_std::nullptr_t> _kjCondition;
  PointerBuilder pointerBuilder;
  
  _kjCondition.left = &this->inner;
  _kjCondition.result = this->inner == (CapTableBuilder *)0x0;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    pointerBuilder.pointer = builder.builder.pointer;
    pointerBuilder.segment = builder.builder.segment;
    pointerBuilder.capTable = builder.builder.capTable;
    pCVar1 = capnp::_::PointerBuilder::getCapTable(&pointerBuilder);
    this->inner = pCVar1;
    capnp::_::PointerBuilder::imbue
              ((PointerBuilder *)&_kjCondition,&pointerBuilder,&this->super_CapTableBuilder);
    (__return_storage_ptr__->builder).pointer = (WirePointer *)_kjCondition.op.content.ptr;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)_kjCondition.left;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)_kjCondition.right;
    return (Builder *)_kjCondition.op.content.ptr;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableBuilder*&,decltype(nullptr)>&,char_const(&)[24]>
            ((Fault *)&pointerBuilder,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x52,FAILED,"inner == nullptr","_kjCondition,\"can only call this once\"",
             &_kjCondition,(char (*) [24])"can only call this once");
  kj::_::Debug::Fault::fatal((Fault *)&pointerBuilder);
}

Assistant:

AnyPointer::Builder imbue(AnyPointer::Builder builder) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    auto pointerBuilder = _::PointerHelpers<AnyPointer>::getInternalBuilder(kj::mv(builder));
    inner = pointerBuilder.getCapTable();
    return AnyPointer::Builder(pointerBuilder.imbue(this));
  }